

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int __thiscall
icu_63::RuleBasedBreakIterator::clone
          (RuleBasedBreakIterator *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RuleBasedBreakIterator *this_00;
  undefined8 local_30;
  RuleBasedBreakIterator *this_local;
  
  this_00 = (RuleBasedBreakIterator *)UMemory::operator_new((UMemory *)0x280,(size_t)__fn);
  local_30 = (RuleBasedBreakIterator *)0x0;
  if (this_00 != (RuleBasedBreakIterator *)0x0) {
    RuleBasedBreakIterator(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

BreakIterator*
RuleBasedBreakIterator::clone(void) const {
    return new RuleBasedBreakIterator(*this);
}